

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# follyqueue.cpp
# Opt level: O2

int read_proc(void)

{
  bool bVar1;
  int iVar2;
  int number;
  
  number = 0;
  iVar2 = result;
  while (iVar2 <= g_maxCount) {
    if (q.readIndex_.super___atomic_base<int>._M_i == q.writeIndex_.super___atomic_base<int>._M_i) {
      usleep(1);
      iVar2 = result;
    }
    else {
      bVar1 = folly::ProducerConsumerQueue<int>::try_dequeue(&q,&number);
      result = (int)bVar1;
      iVar2 = 0;
      if (bVar1) {
        result = number;
        iVar2 = number;
      }
    }
  }
  g_running = false;
  return 0;
}

Assistant:

int read_proc()
{
	int number = 0 ; 
	// You can also peek at the front item of the queue (consumer only)
	while(result <= g_maxCount)
	{
		//int* front = q.peek();
		if (!q.isEmpty())
		{
			result = q.try_dequeue(number); 
			if (result)
			{
				Log("result is "<< result << " num is " << number ); 
				result = number; 
			}
			else 
			{
				Log("dequeue failed"); 

			}
		}
		else 
		{
			usleep(1); 
		}
	}

	g_running = false; 
	Log(" read finished " ); ; 
	return 0; 
}